

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O0

void cf_blockwise_accumulate_final
               (uint8_t *partial,size_t *npartial,size_t nblock,void *inp,size_t nbytes,
               cf_blockwise_in_fn process,cf_blockwise_in_fn process_final,void *ctx)

{
  cf_blockwise_in_fn local_a0;
  size_t local_98;
  size_t __y_1;
  size_t __x_1;
  size_t taken_1;
  size_t space_1;
  size_t __y;
  size_t __x;
  size_t taken;
  size_t space;
  uint8_t *bufin;
  cf_blockwise_in_fn process_local;
  size_t nbytes_local;
  void *inp_local;
  size_t nblock_local;
  size_t *npartial_local;
  uint8_t *partial_local;
  
  if ((partial == (uint8_t *)0x0) || (nblock <= *npartial)) {
    abort();
  }
  if ((inp == (void *)0x0) && (nbytes != 0)) {
    abort();
  }
  if ((process != (cf_blockwise_in_fn)0x0) && (ctx != (void *)0x0)) {
    space = (size_t)inp;
    process_local = (cf_blockwise_in_fn)nbytes;
    if ((*npartial != 0) && (nbytes != 0)) {
      local_98 = nbytes;
      if (nblock - *npartial < nbytes) {
        local_98 = nblock - *npartial;
      }
      memcpy(partial + *npartial,inp,local_98);
      space = local_98 + (long)inp;
      process_local = (cf_blockwise_in_fn)(nbytes - local_98);
      *npartial = local_98 + *npartial;
      if (*npartial == nblock) {
        if (process_local == (cf_blockwise_in_fn)0x0) {
          (*process_final)(ctx,partial);
        }
        else {
          (*process)(ctx,partial);
        }
        *npartial = 0;
      }
    }
    while( true ) {
      if (process_local < nblock) {
        do {
          if (process_local == (cf_blockwise_in_fn)0x0) {
            return;
          }
          local_a0 = (cf_blockwise_in_fn)(nblock - *npartial);
          if (process_local <= local_a0) {
            local_a0 = process_local;
          }
          memcpy(partial + *npartial,(void *)space,(size_t)local_a0);
          space = (size_t)(local_a0 + space);
          process_local = process_local + -(long)local_a0;
          *npartial = (size_t)(local_a0 + *npartial);
        } while (*npartial < nblock);
        abort();
      }
      if (*npartial != 0) break;
      if (process_local == (cf_blockwise_in_fn)nblock) {
        (*process_final)(ctx,(uint8_t *)space);
      }
      else {
        (*process)(ctx,(uint8_t *)space);
      }
      space = nblock + space;
      process_local = process_local + -nblock;
    }
    abort();
  }
  abort();
}

Assistant:

void cf_blockwise_accumulate_final(uint8_t *partial, size_t *npartial, size_t nblock,
                                   const void *inp, size_t nbytes,
                                   cf_blockwise_in_fn process,
                                   cf_blockwise_in_fn process_final,
                                   void *ctx)
{
  const uint8_t *bufin = inp;
  assert(partial && *npartial < nblock);
  assert(inp || !nbytes);
  assert(process && ctx);

  /* If we have partial data, copy in to buffer. */
  if (*npartial && nbytes)
  {
    size_t space = nblock - *npartial;
    size_t taken = MIN(space, nbytes);

    memcpy(partial + *npartial, bufin, taken);

    bufin += taken;
    nbytes -= taken;
    *npartial += taken;

    /* If that gives us a full block, process it. */
    if (*npartial == nblock)
    {
      if (nbytes == 0)
        process_final(ctx, partial);
      else
        process(ctx, partial);
      *npartial = 0;
    }
  }

  /* now nbytes < nblock or *npartial == 0. */

  /* If we have a full block of data, process it directly. */
  while (nbytes >= nblock)
  {
    /* Partial buffer must be empty, or we're ignoring extant data */
    assert(*npartial == 0);

    if (nbytes == nblock)
      process_final(ctx, bufin);
    else
      process(ctx, bufin);
    bufin += nblock;
    nbytes -= nblock;
  }

  /* Finally, if we have remaining data, buffer it. */
  while (nbytes)
  {
    size_t space = nblock - *npartial;
    size_t taken = MIN(space, nbytes);

    memcpy(partial + *npartial, bufin, taken);

    bufin += taken;
    nbytes -= taken;
    *npartial += taken;

    /* If we started with *npartial, we must have copied it
     * in first. */
    assert(*npartial < nblock);
  }
}